

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QColorListModel.cpp
# Opt level: O2

QVariant * __thiscall
QColorListModel::data
          (QVariant *__return_storage_ptr__,QColorListModel *this,QModelIndex *index,int role)

{
  const_reference pQVar1;
  long i;
  QStringList *this_00;
  QIcon aQStack_48 [2];
  QArrayDataPointer<char16_t> local_38;
  QSize local_20;
  
  i = (long)index->r;
  if ((-1 < i) && (i < (this->d->colors).d.size)) {
    this_00 = &this->d->colors;
    if (role == 1) {
      QList<QString>::at(this_00,i);
      QColor::setNamedColor((QString *)&local_38);
      local_20.wd = 0x40;
      local_20.ht = 0x40;
      QtWidgetsExtraCache::cachedIconColor
                ((QtWidgetsExtraCache *)aQStack_48,(QColor *)&local_38,&local_20);
      QIcon::operator_cast_to_QVariant(__return_storage_ptr__,aQStack_48);
      QIcon::~QIcon(aQStack_48);
      return __return_storage_ptr__;
    }
    if ((role & 0xfffffffdU) == 0) {
      QList<QString>::at(this_00,i);
      QColor::setNamedColor((QString *)aQStack_48);
      QColor::name((NameFormat)&local_38);
      QVariant::QVariant(__return_storage_ptr__,(QString *)&local_38);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
      return __return_storage_ptr__;
    }
    if (role == 0x100) {
      pQVar1 = QList<QString>::at(this_00,i);
      QVariant::QVariant(__return_storage_ptr__,(QString *)pQVar1);
      return __return_storage_ptr__;
    }
  }
  (__return_storage_ptr__->d).data.shared = (PrivateShared *)0x0;
  *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 8) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 0x10) = 0;
  *(undefined8 *)&(__return_storage_ptr__->d).field_0x18 = 2;
  return __return_storage_ptr__;
}

Assistant:

QVariant QColorListModel::data(const QModelIndex &index, int role) const {
    if (index.row() < 0 || index.row() >= d->colors.size()) {
        return QVariant();
    }

    if (role == Qt::DecorationRole) {
        return QtWidgetsExtraCache::cachedIconColor(QColor(d->colors.at(index.row())), QSize(64, 64));
    } else if (role == Qt::DisplayRole || role == Qt::EditRole) {
        return QColor(d->colors.at(index.row())).name(QColor::NameFormat(d->nameFormat));
    } else if (role == static_cast<int>(QColorListModel::Role::HexArgbName)) {
        return d->colors.at(index.row());
    }

    return QVariant();
}